

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<double,__1,__1> __thiscall Matrix<double,_-1,_-1>::Identity(Matrix<double,__1,__1> *this)

{
  int iVar1;
  int row;
  int iVar2;
  double num;
  Matrix<double,__1,__1> MVar3;
  
  iVar2 = this->rows;
  if (iVar2 == this->cols) {
    if (0 < iVar2) {
      row = 0;
      iVar1 = iVar2;
      do {
        if (0 < iVar1) {
          iVar2 = 0;
          do {
            if (row == iVar2) {
              num = 1.0;
              iVar1 = row;
            }
            else {
              num = 0.0;
              iVar1 = iVar2;
            }
            SetElement(this,row,iVar1,num);
            iVar2 = iVar2 + 1;
            iVar1 = this->cols;
          } while (iVar2 < iVar1);
          iVar2 = this->rows;
        }
        row = row + 1;
      } while (row < iVar2);
    }
    MVar3 = *this;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"identity matrix can only be initialized by square matrix",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    MVar3 = Zero(this);
  }
  return MVar3;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::Identity()
{
    // 这样的实现方法会导致过多占用内存
    // 故不使用静态成员的方法实现
    // 2020 09 10
    // Matrix<Type, _0, _1> Identity;

    // 2020 09 11 
    // 恢复使用静态方法  问题已解决

    if(this->row() != this->col())
    {
        cerr << "identity matrix can only be initialized by square matrix" << endl;
        return this->Zero();
    }
    for (int i = 0; i < this->row(); ++i)
        for(int j = 0; j < this->col(); ++j)
            if(i == j)
                this->SetElement(i, j, 1);
            else
                this->SetElement(i, j, 0);
    return (*this);
}